

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9CompileFor(jx9_gen_state *pGen)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  SySet *pSVar4;
  SyToken *pSVar5;
  GenBlock *pBlock;
  bool bVar6;
  sxi32 sVar7;
  sxi32 sVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  char *zFormat;
  sxu32 nLine;
  SyToken *pSVar12;
  ulong uVar13;
  SyToken *pSVar14;
  SyToken *pSVar15;
  GenBlock *pForBlock;
  sxu32 nFalseJump;
  GenBlock *local_48;
  sxu32 local_3c [3];
  
  local_48 = (GenBlock *)0x0;
  pSVar14 = pGen->pIn;
  pSVar15 = pGen->pEnd;
  nLine = pSVar14->nLine;
  pGen->pIn = pSVar14 + 1;
  if ((pSVar14 + 1 < pSVar15) && ((pSVar14[1].nType & 0x200) != 0)) {
    pGen->pIn = pSVar14 + 2;
    lVar9 = 0x40;
    if (pSVar14 + 2 < pSVar15) {
      iVar11 = 1;
      do {
        uVar1 = *(uint *)((long)&pSVar14->nType + lVar9);
        if ((uVar1 >> 9 & 1) == 0) {
          if ((uVar1 >> 10 & 1) != 0) {
            if (iVar11 < 2) break;
            iVar11 = iVar11 + -1;
          }
        }
        else {
          iVar11 = iVar11 + 1;
        }
        pSVar12 = (SyToken *)((long)&pSVar14[1].sData.zString + lVar9);
        lVar9 = lVar9 + 0x20;
      } while (pSVar12 < pSVar15);
    }
    pSVar14 = (SyToken *)((long)&(pSVar14->sData).zString + lVar9);
    if (lVar9 == 0x40 || pSVar15 <= pSVar14) {
      sVar8 = jx9GenCompileError(pGen,1,nLine,"for: Invalid expression");
      if (sVar8 == -10) {
        return -10;
      }
      pGen->pIn = pSVar14;
      if (pSVar14 < pGen->pEnd) {
        pGen->pIn = pSVar14 + 1;
      }
      return 0;
    }
    pGen->pEnd = pSVar14;
    sVar8 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    if (sVar8 == -10) {
      return -10;
    }
    if (sVar8 != -3) {
      jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
    }
    pSVar12 = pGen->pIn;
    if ((pSVar12->nType & 0x40000) == 0) {
      nLine = pSVar12->nLine;
      zFormat = "for: Expected \';\' after initialization expressions";
    }
    else {
      pGen->pIn = pSVar12 + 1;
      sVar8 = GenStateEnterBlock(pGen,1,pGen->pVm->pByteContainer->nUsed,(void *)0x0,&local_48);
      if (sVar8 != 0) {
        return -10;
      }
      local_48->bPostContinue = '\x01';
      sVar8 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
      if (sVar8 == -10) {
        return -10;
      }
      if (sVar8 != -3) {
        jx9VmEmitInstr(pGen->pVm,9,0,0,(void *)0x0,local_3c);
        local_3c[1] = 9;
        local_3c[2] = local_3c[0];
        SySetPut(&local_48->aJumpFix,local_3c + 1);
      }
      pSVar12 = pGen->pIn;
      if ((pSVar12->nType & 0x40000) != 0) {
        pGen->pIn = pSVar14 + 1;
        pGen->pEnd = pSVar15;
        sVar8 = jx9CompileBlock(pGen);
        if (sVar8 == -10) {
          return -10;
        }
        uVar10 = (ulong)(local_48->aPostContFix).nUsed;
        if (uVar10 != 0) {
          pvVar3 = (local_48->aPostContFix).pBase;
          pSVar4 = pGen->pVm->pByteContainer;
          uVar1 = pSVar4->nUsed;
          uVar13 = 0;
          do {
            uVar2 = *(uint *)((long)pvVar3 + uVar13 * 8 + 4);
            if (uVar2 < uVar1) {
              lVar9 = (ulong)(uVar2 * pSVar4->eSize) + (long)pSVar4->pBase;
            }
            else {
              lVar9 = 0;
            }
            if (lVar9 != 0) {
              *(uint *)(lVar9 + 8) = uVar1;
            }
            uVar13 = uVar13 + 1;
          } while (uVar10 != uVar13);
        }
        do {
          pSVar15 = pSVar12 + 1;
          if (pSVar14 <= pSVar15) goto LAB_00126e69;
          pSVar5 = pSVar12 + 1;
          pSVar12 = pSVar15;
        } while ((pSVar5->nType & 0x40000) != 0);
        if (pSVar15 < pSVar14) {
          pSVar12 = pGen->pIn;
          pSVar5 = pGen->pEnd;
          pGen->pIn = pSVar15;
          pGen->pEnd = pSVar14;
          bVar6 = false;
          sVar8 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
          if (pGen->pIn < pGen->pEnd) {
            sVar7 = jx9GenCompileError(pGen,1,pGen->pIn->nLine,
                                       "for: Expected \')\' after post-expressions");
            sVar8 = 0;
            if (sVar7 == -10) {
              sVar8 = -10;
            }
          }
          else {
            pGen->pIn = pSVar12;
            pGen->pEnd = pSVar5;
            if (sVar8 == -10) {
              bVar6 = false;
            }
            else {
              if (sVar8 != -3) {
                jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
              }
              bVar6 = true;
            }
          }
          if (!bVar6) {
            return sVar8;
          }
        }
LAB_00126e69:
        jx9VmEmitInstr(pGen->pVm,8,0,local_48->nFirstInstr,(void *)0x0,(sxu32 *)0x0);
        GenStateFixJumps(local_48,-1,pGen->pVm->pByteContainer->nUsed);
        pBlock = pGen->pCurrent;
        if (pBlock == (GenBlock *)0x0) {
          return 0;
        }
        pGen->pCurrent = pBlock->pParent;
        GenStateFreeBlock(pBlock);
        return 0;
      }
      nLine = pSVar12->nLine;
      zFormat = "for: Expected \';\' after conditionals expressions";
    }
  }
  else {
    zFormat = "Expected \'(\' after \'for\' keyword";
  }
  sVar7 = jx9GenCompileError(pGen,1,nLine,zFormat);
  sVar8 = 0;
  if (sVar7 == -10) {
    sVar8 = -10;
  }
  return sVar8;
}

Assistant:

static sxi32 jx9CompileFor(jx9_gen_state *pGen)
{
	SyToken *pTmp, *pPostStart, *pEnd = 0;
	GenBlock *pForBlock = 0;
	sxu32 nFalseJump;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'for' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after 'for' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	/* Delimit the init-expr;condition;post-expr */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "for: Invalid expression");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		/* Synchronize */
		pGen->pIn = pEnd;
		if( pGen->pIn < pGen->pEnd ){
			pGen->pIn++;
		}
		return SXRET_OK;
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	/* Compile initialization expressions if available */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Pop operand lvalues */
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}else if( rc != SXERR_EMPTY ){
		jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
	}
	if( (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, 
			"for: Expected ';' after initialization expressions");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Jump the trailing ';' */
	pGen->pIn++;
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP, jx9VmInstrLength(pGen->pVm), 0, &pForBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Deffer continue jumps */
	pForBlock->bPostContinue = TRUE;
	/* Compile the condition */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}else if( rc != SXERR_EMPTY ){
		/* Emit the false jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nFalseJump);
		/* Save the instruction index so we can fix it later when the jump destination is resolved */
		GenStateNewJumpFixup(pForBlock, JX9_OP_JZ, nFalseJump);
	}
	if( (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, 
			"for: Expected ';' after conditionals expressions");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Jump the trailing ';' */
	pGen->pIn++;
	/* Save the post condition stream */
	pPostStart = pGen->pIn;
	/* Compile the loop body */
	pGen->pIn  = &pEnd[1]; /* Jump the trailing parenthesis ')' */
	pGen->pEnd = pTmp;
	rc = jx9CompileBlock(&(*pGen));
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	/* Fix post-continue jumps */
	if( SySetUsed(&pForBlock->aPostContFix) > 0 ){
		JumpFixup *aPost;
		VmInstr *pInstr;
		sxu32 nJumpDest;
		sxu32 n;
		aPost = (JumpFixup *)SySetBasePtr(&pForBlock->aPostContFix);
		nJumpDest = jx9VmInstrLength(pGen->pVm);
		for( n = 0 ; n < SySetUsed(&pForBlock->aPostContFix) ; ++n ){
			pInstr = jx9VmGetInstr(pGen->pVm, aPost[n].nInstrIdx);
			if( pInstr ){
				/* Fix jump */
				pInstr->iP2 = nJumpDest;
			}
		}
	}
	/* compile the post-expressions if available */
	while( pPostStart < pEnd && (pPostStart->nType & JX9_TK_SEMI) ){
		pPostStart++;
	}
	if( pPostStart < pEnd ){
		SyToken *pTmpIn, *pTmpEnd;
		SWAP_DELIMITER(pGen, pPostStart, pEnd);
		rc = jx9CompileExpr(&(*pGen), 0, 0);
		if( pGen->pIn < pGen->pEnd ){
			/* Syntax error */
			rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, "for: Expected ')' after post-expressions");
			if( rc == SXERR_ABORT ){
				/* Error count limit reached, abort immediately */
				return SXERR_ABORT;
			}
			return SXRET_OK;
		}
		RE_SWAP_DELIMITER(pGen);
		if( rc == SXERR_ABORT ){
			/* Expression handler request an operation abort [i.e: Out-of-memory] */
			return SXERR_ABORT;
		}else if( rc != SXERR_EMPTY){
			/* Pop operand lvalue */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
		}
	}
	/* Emit the unconditional jump to the start of the loop */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pForBlock->nFirstInstr, 0, 0);
	/* Fix all jumps now the destination is resolved */
	GenStateFixJumps(pForBlock, -1, jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	/* Statement successfully compiled */
	return SXRET_OK;
}